

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O1

adios2_error adios2_put(adios2_engine *engine,adios2_variable *variable,void *data,adios2_mode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  signed *psVar3;
  char *pcVar4;
  uchar *puVar5;
  complex *pcVar6;
  double *pdVar7;
  int *piVar8;
  long *plVar9;
  ulong *puVar10;
  short *psVar11;
  ushort *puVar12;
  string *psVar13;
  uint *puVar14;
  longdouble *plVar15;
  float *pfVar16;
  Mode MVar17;
  string dataStr;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_engine, in call to adios2_put","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"for adios2_variable, in call to adios2_put","");
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar2 = *(undefined4 *)(variable + 0x28);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_put","");
  anon_unknown.dwarf_408b0::adios2_ToMode(mode,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  MVar17 = (Mode)data;
  switch(uVar2) {
  case 1:
    psVar3 = (signed *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Engine::Put<signed_char>((Variable *)engine,psVar3,MVar17);
    break;
  case 2:
    psVar11 = (short *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Engine::Put<short>((Variable *)engine,psVar11,MVar17);
    break;
  case 3:
    piVar8 = (int *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Engine::Put<int>((Variable *)engine,piVar8,MVar17);
    break;
  case 4:
    plVar9 = (long *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Engine::Put<long>((Variable *)engine,plVar9,MVar17);
    break;
  case 5:
    puVar5 = (uchar *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_char>((Variable *)engine,puVar5,MVar17);
    break;
  case 6:
    puVar12 = (ushort *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_short>((Variable *)engine,puVar12,MVar17);
    break;
  case 7:
    puVar14 = (uint *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_int>((Variable *)engine,puVar14,MVar17);
    break;
  case 8:
    puVar10 = (ulong *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Engine::Put<unsigned_long>((Variable *)engine,puVar10,MVar17);
    break;
  case 9:
    pfVar16 = (float *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Engine::Put<float>((Variable *)engine,pfVar16,MVar17);
    break;
  case 10:
    pdVar7 = (double *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Engine::Put<double>((Variable *)engine,pdVar7,MVar17);
    break;
  case 0xb:
    plVar15 = (longdouble *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Engine::Put<long_double>((Variable *)engine,plVar15,MVar17);
    break;
  case 0xc:
    pcVar6 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Engine::Put<std::complex<float>>((Variable *)engine,pcVar6,MVar17);
    break;
  case 0xd:
    pcVar6 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Engine::Put<std::complex<double>>((Variable *)engine,pcVar6,MVar17);
    break;
  case 0xe:
    std::__cxx11::string::string((string *)&local_90,(char *)data,&local_91);
    psVar13 = (string *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Engine::Put<std::__cxx11::string>((Variable *)engine,psVar13,(Mode)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    break;
  case 0xf:
    pcVar4 = (char *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Engine::Put<char>((Variable *)engine,pcVar4,MVar17);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_put(adios2_engine *engine, adios2_variable *variable, const void *data,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_put");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to adios2_put");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        const adios2::DataType type(variableBase->m_Type);

        const adios2::Mode modeCpp =
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "
                                "in call to adios2_put");

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const std::string dataStr(reinterpret_cast<const char *>(data));
            engineCpp->Put(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr, modeCpp);
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        engineCpp->Put(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<const T *>(data), modeCpp);                                \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_put"));
    }
}